

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::UnicodeString::doAppend
          (UnicodeString *this,UChar *srcChars,int32_t srcStart,int32_t srcLength)

{
  UBool UVar1;
  int32_t dstStart;
  int newLength_00;
  int32_t iVar2;
  UChar *s;
  char16_t *pcVar3;
  UChar *newArray;
  undefined1 local_78 [8];
  UnicodeString copy;
  UChar *oldArray;
  int32_t newLength;
  int32_t oldLength;
  int32_t srcLength_local;
  int32_t srcStart_local;
  UChar *srcChars_local;
  UnicodeString *this_local;
  
  UVar1 = isWritable(this);
  this_local = this;
  if ((((UVar1 != '\0') && (srcLength != 0)) && (srcChars != (UChar *)0x0)) &&
     ((s = srcChars + srcStart, newLength = srcLength, -1 < srcLength ||
      (newLength = u_strlen_63(s), newLength != 0)))) {
    dstStart = length(this);
    newLength_00 = dstStart + newLength;
    copy.fUnion._48_8_ = getArrayStart(this);
    UVar1 = isBufferWritable(this);
    if ((UVar1 == '\0') ||
       ((s + newLength <= (ulong)copy.fUnion._48_8_ ||
        ((UChar *)(copy.fUnion._48_8_ + (long)dstStart * 2) <= s)))) {
      iVar2 = getCapacity(this);
      if ((iVar2 < newLength_00) || (UVar1 = isBufferWritable(this), UVar1 == '\0')) {
        iVar2 = anon_unknown_11::getGrowCapacity(newLength_00);
        UVar1 = cloneArrayIfNeeded(this,newLength_00,iVar2,'\x01',(int32_t **)0x0,'\0');
        if (UVar1 == '\0') {
          return this;
        }
      }
      pcVar3 = getArrayStart(this);
      if (s != pcVar3 + dstStart) {
        us_arrayCopy(s,0,pcVar3,dstStart,newLength);
      }
      setLength(this,newLength_00);
    }
    else {
      UnicodeString((UnicodeString *)local_78,s,newLength);
      UVar1 = isBogus((UnicodeString *)local_78);
      if (UVar1 == '\0') {
        pcVar3 = getArrayStart((UnicodeString *)local_78);
        this_local = doAppend(this,pcVar3,0,newLength);
      }
      else {
        setToBogus(this);
      }
      ~UnicodeString((UnicodeString *)local_78);
    }
  }
  return this_local;
}

Assistant:

UnicodeString&
UnicodeString::doAppend(const UChar *srcChars, int32_t srcStart, int32_t srcLength) {
  if(!isWritable() || srcLength == 0 || srcChars == NULL) {
    return *this;
  }

  // Perform all remaining operations relative to srcChars + srcStart.
  // From this point forward, do not use srcStart.
  srcChars += srcStart;

  if(srcLength < 0) {
    // get the srcLength if necessary
    if((srcLength = u_strlen(srcChars)) == 0) {
      return *this;
    }
  }

  int32_t oldLength = length();
  int32_t newLength = oldLength + srcLength;

  // Check for append onto ourself
  const UChar* oldArray = getArrayStart();
  if (isBufferWritable() &&
      oldArray < srcChars + srcLength &&
      srcChars < oldArray + oldLength) {
    // Copy into a new UnicodeString and start over
    UnicodeString copy(srcChars, srcLength);
    if (copy.isBogus()) {
      setToBogus();
      return *this;
    }
    return doAppend(copy.getArrayStart(), 0, srcLength);
  }

  // optimize append() onto a large-enough, owned string
  if((newLength <= getCapacity() && isBufferWritable()) ||
      cloneArrayIfNeeded(newLength, getGrowCapacity(newLength))) {
    UChar *newArray = getArrayStart();
    // Do not copy characters when
    //   UChar *buffer=str.getAppendBuffer(...);
    // is followed by
    //   str.append(buffer, length);
    // or
    //   str.appendString(buffer, length)
    // or similar.
    if(srcChars != newArray + oldLength) {
      us_arrayCopy(srcChars, 0, newArray, oldLength, srcLength);
    }
    setLength(newLength);
  }
  return *this;
}